

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O1

int run_test_spawn_stdout_to_file(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  uint uVar7;
  uint file;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *puVar8;
  uv_loop_t *puVar9;
  uv_process_options_t *puVar10;
  int extraout_EDX;
  char *pcVar11;
  char *pcVar12;
  uv__queue *unaff_RBP;
  int iVar13;
  undefined1 *puVar14;
  uv_handle_t *puVar15;
  uv_process_options_t *unaff_R14;
  uv__queue *unaff_R15;
  int64_t eval_b_1;
  int64_t eval_b_5;
  int64_t eval_b;
  uv_stdio_container_t stdio [2];
  uv_fs_t fs_req;
  undefined1 auStackY_f28 [48];
  uv_loop_t *puStackY_ef8;
  long lStackY_ee8;
  long lStackY_ee0;
  uv_loop_t *puStackY_ed8;
  uv_process_options_t *puStackY_ed0;
  long lStackY_ec0;
  long lStackY_eb8;
  uv_os_fd_t uStackY_eac;
  uv_stdio_container_t uStackY_ea8;
  undefined4 uStackY_e98;
  undefined4 uStackY_e90;
  undefined4 uStackY_e88;
  undefined4 uStackY_e80;
  undefined4 uStackY_e78;
  uv_os_fd_t uStackY_e70;
  sockaddr_in sStackY_e68;
  uv_loop_t *puStackY_e58;
  undefined8 uStackY_e50;
  long lStackY_e48;
  uv_tcp_t uStackY_e40;
  long lStackY_d68;
  long lStackY_d60;
  uv_stdio_container_t uStackY_d58;
  undefined4 uStackY_d48;
  undefined4 uStackY_d38;
  undefined4 uStackY_d28;
  uv_loop_t *puStackY_d20;
  undefined1 auStackY_d10 [296];
  undefined1 auStackY_be8 [16];
  char acStackY_bd8 [32];
  uv_stdio_container_t uStackY_bb8;
  undefined4 uStackY_ba8;
  uv_loop_t *puStackY_ba0;
  uv_write_t uStackY_b90;
  uv_stream_t uStackY_ac8;
  uv_stream_t uStackY_9e0;
  uv_loop_t *puStackY_8f8;
  uv_fs_t *puStackY_8f0;
  uv__queue *puStackY_8e8;
  uv_buf_t uStack_8c0;
  uv_rwlock_t uStack_8b0;
  uv_fs_t uStack_878;
  uv_loop_t *puStack_6b8;
  uv_fs_t *puStack_6b0;
  uv_buf_t uStack_678;
  uv_stdio_container_t uStack_668;
  undefined4 uStack_658;
  uint uStack_650;
  undefined4 uStack_648;
  uint uStack_640;
  uv_fs_t uStack_638;
  uv_loop_t *puStack_478;
  uv_fs_t *puStack_470;
  uv_buf_t uStack_440;
  uv_stdio_container_t uStack_430;
  undefined4 uStack_420;
  uint uStack_418;
  undefined4 uStack_410;
  uint uStack_408;
  uv_fs_t uStack_3f8;
  uv_loop_t *puStack_238;
  uv_fs_t *puStack_230;
  uv_buf_t local_208;
  uv_stdio_container_t local_1f8;
  undefined4 local_1e8;
  uint local_1e0;
  uv_fs_t local_1d0;
  
  uStack_8c0.len = (size_t)uStack_8c0.base;
  uStack_678.len = (size_t)uStack_678.base;
  uStack_440.len = (size_t)uStack_440.base;
  local_208.len = (size_t)local_208.base;
  pcVar11 = "stdout_file";
  puStack_230 = (uv_fs_t *)0x1bb81a;
  unlink("stdout_file");
  puStack_230 = (uv_fs_t *)0x1bb82d;
  init_process_options("spawn_helper2",exit_cb);
  puStack_230 = (uv_fs_t *)0x1bb84a;
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&local_1d0,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  local_1f8._0_8_ = SEXT48(iVar6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_208.len;
  local_208 = (uv_buf_t)(auVar2 << 0x40);
  if (local_1f8._0_8_ == 0) {
    pcVar11 = (char *)(ulong)(uint)local_1d0.result;
    puStack_230 = (uv_fs_t *)0x1bb877;
    uv_fs_req_cleanup(&local_1d0);
    options.stdio = &local_1f8;
    unaff_R14 = &options;
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    local_1e8 = 2;
    local_1e0 = (uint)local_1d0.result;
    options.stdio_count = 2;
    puStack_230 = (uv_fs_t *)0x1bb8a6;
    puVar8 = uv_default_loop();
    puStack_230 = (uv_fs_t *)0x1bb8b8;
    iVar6 = uv_spawn(puVar8,&process,&options);
    local_208.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbab6;
    puStack_230 = (uv_fs_t *)0x1bb8dd;
    puVar8 = uv_default_loop();
    puStack_230 = (uv_fs_t *)0x1bb8e7;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    local_208.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbac5;
    local_208.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bbad4;
    local_208.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bbae3;
    puStack_230 = (uv_fs_t *)0x1bb962;
    local_208 = uv_buf_init(output,0x400);
    puStack_230 = (uv_fs_t *)0x1bb98d;
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&local_1d0,(uint)local_1d0.result,&local_208,1,0,
                       (uv_fs_cb)0x0);
    if (iVar6 != 0xc) goto LAB_001bbaf2;
    unaff_R14 = (uv_process_options_t *)&local_1d0;
    puStack_230 = (uv_fs_t *)0x1bb9ba;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    puStack_230 = (uv_fs_t *)0x1bb9c8;
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,(uint)local_1d0.result,(uv_fs_cb)0x0);
    if (iVar6 != 0) goto LAB_001bbb01;
    puStack_230 = (uv_fs_t *)0x1bb9f2;
    uv_fs_req_cleanup(&local_1d0);
    pcVar11 = output;
    puStack_230 = (uv_fs_t *)0x1bba0a;
    printf("output is: %s",output);
    puStack_230 = (uv_fs_t *)0x1bba19;
    iVar6 = strcmp("hello world\n",output);
    if (iVar6 != 0) goto LAB_001bbb10;
    puStack_230 = (uv_fs_t *)0x1bba45;
    unlink("stdout_file");
    puStack_230 = (uv_fs_t *)0x1bba4a;
    pcVar11 = (char *)uv_default_loop();
    puStack_230 = (uv_fs_t *)0x1bba5e;
    uv_walk((uv_loop_t *)pcVar11,close_walk_cb,(void *)0x0);
    puStack_230 = (uv_fs_t *)0x1bba68;
    uv_run((uv_loop_t *)pcVar11,UV_RUN_DEFAULT);
    puStack_230 = (uv_fs_t *)0x1bba76;
    puVar8 = uv_default_loop();
    puStack_230 = (uv_fs_t *)0x1bba7e;
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      puStack_230 = (uv_fs_t *)0x1bba9a;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_230 = (uv_fs_t *)0x1bbab6;
    run_test_spawn_stdout_to_file_cold_1();
LAB_001bbab6:
    puStack_230 = (uv_fs_t *)0x1bbac5;
    run_test_spawn_stdout_to_file_cold_2();
LAB_001bbac5:
    puStack_230 = (uv_fs_t *)0x1bbad4;
    run_test_spawn_stdout_to_file_cold_3();
LAB_001bbad4:
    puStack_230 = (uv_fs_t *)0x1bbae3;
    run_test_spawn_stdout_to_file_cold_4();
LAB_001bbae3:
    puStack_230 = (uv_fs_t *)0x1bbaf2;
    run_test_spawn_stdout_to_file_cold_5();
LAB_001bbaf2:
    puStack_230 = (uv_fs_t *)0x1bbb01;
    run_test_spawn_stdout_to_file_cold_6();
LAB_001bbb01:
    puStack_230 = (uv_fs_t *)0x1bbb10;
    run_test_spawn_stdout_to_file_cold_7();
LAB_001bbb10:
    puStack_230 = (uv_fs_t *)0x1bbb1f;
    run_test_spawn_stdout_to_file_cold_8();
  }
  puStack_230 = (uv_fs_t *)run_test_spawn_stdout_and_stderr_to_file;
  run_test_spawn_stdout_to_file_cold_9();
  pcVar12 = "stdout_file";
  puStack_238 = (uv_loop_t *)pcVar11;
  puStack_230 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_3f8,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uStack_430._0_8_ = SEXT48(iVar6);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uStack_440.len;
  uStack_440 = (uv_buf_t)(auVar3 << 0x40);
  if (uStack_430._0_8_ == 0) {
    pcVar12 = (char *)(ulong)(uint)uStack_3f8.result;
    uv_fs_req_cleanup(&uStack_3f8);
    options.stdio = &uStack_430;
    unaff_R14 = &options;
    uStack_430._0_8_ = uStack_430._0_8_ & 0xffffffff00000000;
    uStack_420 = 2;
    uStack_418 = (uint)uStack_3f8.result;
    uStack_410 = 2;
    uStack_408 = (uint)uStack_3f8.result;
    options.stdio_count = 3;
    puVar8 = uv_default_loop();
    iVar6 = uv_spawn(puVar8,&process,&options);
    uStack_440.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbded;
    puVar8 = uv_default_loop();
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    uStack_440.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bbdfc;
    uStack_440.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bbe0b;
    uStack_440.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bbe1a;
    uStack_440 = uv_buf_init(output,0x400);
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_3f8,(uint)uStack_3f8.result,&uStack_440,1,0,
                       (uv_fs_cb)0x0);
    if (iVar6 != 0x1b) goto LAB_001bbe29;
    unaff_R14 = (uv_process_options_t *)&uStack_3f8;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,(uint)uStack_3f8.result,(uv_fs_cb)0x0)
    ;
    if (iVar6 != 0) goto LAB_001bbe38;
    uv_fs_req_cleanup(&uStack_3f8);
    pcVar12 = output;
    printf("output is: %s",output);
    iVar6 = strcmp("hello world\nhello errworld\n",output);
    if (iVar6 != 0) goto LAB_001bbe47;
    unlink("stdout_file");
    pcVar12 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar12,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar12,UV_RUN_DEFAULT);
    puVar8 = uv_default_loop();
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file_cold_1();
LAB_001bbded:
    run_test_spawn_stdout_and_stderr_to_file_cold_2();
LAB_001bbdfc:
    run_test_spawn_stdout_and_stderr_to_file_cold_3();
LAB_001bbe0b:
    run_test_spawn_stdout_and_stderr_to_file_cold_4();
LAB_001bbe1a:
    run_test_spawn_stdout_and_stderr_to_file_cold_5();
LAB_001bbe29:
    run_test_spawn_stdout_and_stderr_to_file_cold_6();
LAB_001bbe38:
    run_test_spawn_stdout_and_stderr_to_file_cold_7();
LAB_001bbe47:
    run_test_spawn_stdout_and_stderr_to_file_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file_cold_9();
  pcVar11 = "stdout_file";
  puStack_478 = (uv_loop_t *)pcVar12;
  puStack_470 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  init_process_options("spawn_helper6",exit_cb);
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_638,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uStack_668._0_8_ = SEXT48(iVar6);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uStack_678.len;
  uStack_678 = (uv_buf_t)(auVar4 << 0x40);
  if (uStack_668._0_8_ == 0) {
    uv_fs_req_cleanup(&uStack_638);
    unaff_RBP = (uv__queue *)0x2;
    uVar7 = dup2((int)uStack_638.result,2);
    pcVar11 = (char *)(ulong)uVar7;
    uStack_668._0_8_ = SEXT48((int)uVar7);
    uStack_678.base = (char *)0xffffffffffffffff;
    if (uStack_668._0_8_ == -1) goto LAB_001bc154;
    options.stdio = &uStack_668;
    unaff_R14 = &options;
    uStack_668._4_4_ = (int)uVar7 >> 0x1f;
    uStack_668._0_8_ = (ulong)(uint)uStack_668._4_4_ << 0x20;
    uStack_658 = 2;
    uStack_648 = 2;
    options.stdio_count = 3;
    uStack_650 = uVar7;
    uStack_640 = uVar7;
    puVar8 = uv_default_loop();
    iVar6 = uv_spawn(puVar8,&process,&options);
    uStack_678.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc163;
    puVar8 = uv_default_loop();
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    uStack_678.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc172;
    uStack_678.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc181;
    uStack_678.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc190;
    uStack_678 = uv_buf_init(output,0x400);
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_638,uVar7,&uStack_678,1,0,(uv_fs_cb)0x0);
    if (iVar6 != 0x1b) goto LAB_001bc19f;
    unaff_R14 = (uv_process_options_t *)&uStack_638;
    uv_fs_req_cleanup((uv_fs_t *)unaff_R14);
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)unaff_R14,uVar7,(uv_fs_cb)0x0);
    if (iVar6 != 0) goto LAB_001bc1ae;
    uv_fs_req_cleanup(&uStack_638);
    pcVar11 = output;
    printf("output is: %s",output);
    iVar6 = strcmp("hello world\nhello errworld\n",output);
    if (iVar6 != 0) goto LAB_001bc1bd;
    unlink("stdout_file");
    pcVar11 = (char *)uv_default_loop();
    uv_walk((uv_loop_t *)pcVar11,close_walk_cb,(void *)0x0);
    uv_run((uv_loop_t *)pcVar11,UV_RUN_DEFAULT);
    puVar8 = uv_default_loop();
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_stdout_and_stderr_to_file2_cold_1();
LAB_001bc154:
    run_test_spawn_stdout_and_stderr_to_file2_cold_10();
LAB_001bc163:
    run_test_spawn_stdout_and_stderr_to_file2_cold_2();
LAB_001bc172:
    run_test_spawn_stdout_and_stderr_to_file2_cold_3();
LAB_001bc181:
    run_test_spawn_stdout_and_stderr_to_file2_cold_4();
LAB_001bc190:
    run_test_spawn_stdout_and_stderr_to_file2_cold_5();
LAB_001bc19f:
    run_test_spawn_stdout_and_stderr_to_file2_cold_6();
LAB_001bc1ae:
    run_test_spawn_stdout_and_stderr_to_file2_cold_7();
LAB_001bc1bd:
    run_test_spawn_stdout_and_stderr_to_file2_cold_8();
  }
  run_test_spawn_stdout_and_stderr_to_file2_cold_9();
  pcVar12 = "stdout_file";
  puStackY_8e8 = (uv__queue *)0x1bc1f7;
  puStack_6b8 = (uv_loop_t *)pcVar11;
  puStack_6b0 = (uv_fs_t *)unaff_R14;
  unlink("stdout_file");
  puStackY_8e8 = (uv__queue *)0x1bc203;
  unlink("stderr_file");
  puStackY_8e8 = (uv__queue *)0x1bc216;
  init_process_options("spawn_helper6",exit_cb);
  puStackY_8e8 = (uv__queue *)0x1bc233;
  iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_878,"stdout_file",0x42,0x180,(uv_fs_cb)0x0);
  uVar7 = (uint)uStack_878.result;
  uStack_8b0.__align = (long)iVar6;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uStack_8c0.len;
  uStack_8c0 = (uv_buf_t)(auVar5 << 0x40);
  if (uStack_8b0.__align == 0) {
    pcVar12 = (char *)(ulong)(uint)uStack_878.result;
    puStackY_8e8 = (uv__queue *)0x1bc260;
    uv_fs_req_cleanup(&uStack_878);
    puStackY_8e8 = (uv__queue *)0x1bc26c;
    uVar7 = dup2(uVar7,1);
    unaff_RBP = (uv__queue *)(ulong)uVar7;
    uStack_8b0.__align = (long)(int)uVar7;
    uStack_8c0.base = (char *)0xffffffffffffffff;
    if (uStack_8b0.__align == -1) goto LAB_001bc63f;
    puStackY_8e8 = (uv__queue *)0x1bc2af;
    iVar6 = uv_fs_open((uv_loop_t *)0x0,&uStack_878,"stderr_file",0x42,0x180,(uv_fs_cb)0x0);
    uStack_8b0.__align = (long)iVar6;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uStack_8c0.len;
    uStack_8c0 = (uv_buf_t)(auVar1 << 0x40);
    if (uStack_8b0.__align != 0) goto LAB_001bc64e;
    puStackY_8e8 = (uv__queue *)0x1bc2dc;
    uv_fs_req_cleanup(&uStack_878);
    unaff_R15 = (uv__queue *)0x2;
    puStackY_8e8 = (uv__queue *)0x1bc2ee;
    file = dup2((uint)uStack_878.result,2);
    pcVar12 = (char *)(ulong)file;
    uStack_8b0.__align = (long)(int)file;
    uStack_8c0.base = (char *)0xffffffffffffffff;
    if (uStack_8b0.__align == -1) goto LAB_001bc65d;
    options.stdio = (uv_stdio_container_t *)&uStack_8b0;
    unaff_R14 = &options;
    uStack_8b0.__data.__writers = (int)file >> 0x1f;
    uStack_8b0.__align = (ulong)uStack_8b0.__data.__writers << 0x20;
    uStack_8b0.__data.__pad3 = 2;
    uStack_8b0._32_4_ = 2;
    options.stdio_count = 3;
    puStackY_8e8 = (uv__queue *)0x1bc346;
    uStack_8b0.__data.__cur_writer = file;
    uStack_8b0.__data.__pad2._0_4_ = uVar7;
    puVar8 = uv_default_loop();
    puStackY_8e8 = (uv__queue *)0x1bc358;
    iVar6 = uv_spawn(puVar8,&process,&options);
    uStack_8c0.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc66c;
    puStackY_8e8 = (uv__queue *)0x1bc37d;
    puVar8 = uv_default_loop();
    puStackY_8e8 = (uv__queue *)0x1bc387;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    uStack_8c0.base = (char *)(long)iVar6;
    if ((char *)(long)iVar6 != (char *)0x0) goto LAB_001bc67b;
    uStack_8c0.base = (char *)0x1;
    if (exit_cb_called != 1) goto LAB_001bc68a;
    uStack_8c0.base = (char *)0x1;
    if (close_cb_called != 1) goto LAB_001bc699;
    puStackY_8e8 = (uv__queue *)0x1bc402;
    uStack_8c0 = uv_buf_init(output,0x400);
    puStackY_8e8 = (uv__queue *)0x1bc42d;
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_878,uVar7,&uStack_8c0,1,0,(uv_fs_cb)0x0);
    pcVar11 = (char *)unaff_R14;
    if (iVar6 < 0xf) goto LAB_001bc6a8;
    pcVar11 = (char *)&uStack_878;
    puStackY_8e8 = (uv__queue *)0x1bc45a;
    uv_fs_req_cleanup((uv_fs_t *)pcVar11);
    puStackY_8e8 = (uv__queue *)0x1bc468;
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)pcVar11,uVar7,(uv_fs_cb)0x0);
    if (iVar6 != 0) goto LAB_001bc6b7;
    puStackY_8e8 = (uv__queue *)0x1bc492;
    uv_fs_req_cleanup(&uStack_878);
    pcVar11 = output;
    puStackY_8e8 = (uv__queue *)0x1bc4aa;
    printf("output is: %s",output);
    puStackY_8e8 = (uv__queue *)0x1bc4be;
    iVar6 = strncmp("hello errworld\n",output,0xf);
    if (iVar6 != 0) goto LAB_001bc6c6;
    puStackY_8e8 = (uv__queue *)0x1bc502;
    iVar6 = uv_fs_read((uv_loop_t *)0x0,&uStack_878,file,&uStack_8c0,1,0,(uv_fs_cb)0x0);
    if (iVar6 < 0xc) goto LAB_001bc6d5;
    pcVar11 = (char *)&uStack_878;
    puStackY_8e8 = (uv__queue *)0x1bc52f;
    uv_fs_req_cleanup((uv_fs_t *)pcVar11);
    puStackY_8e8 = (uv__queue *)0x1bc53d;
    iVar6 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)pcVar11,file,(uv_fs_cb)0x0);
    if (iVar6 != 0) goto LAB_001bc6e4;
    puStackY_8e8 = (uv__queue *)0x1bc567;
    uv_fs_req_cleanup(&uStack_878);
    pcVar12 = output;
    puStackY_8e8 = (uv__queue *)0x1bc57f;
    printf("output is: %s",output);
    puStackY_8e8 = (uv__queue *)0x1bc593;
    iVar6 = strncmp("hello world\n",output,0xc);
    if (iVar6 != 0) goto LAB_001bc6f3;
    puStackY_8e8 = (uv__queue *)0x1bc5bf;
    unlink("stdout_file");
    puStackY_8e8 = (uv__queue *)0x1bc5cb;
    unlink("stderr_file");
    puStackY_8e8 = (uv__queue *)0x1bc5d0;
    pcVar12 = (char *)uv_default_loop();
    puStackY_8e8 = (uv__queue *)0x1bc5e4;
    uv_walk((uv_loop_t *)pcVar12,close_walk_cb,(void *)0x0);
    puStackY_8e8 = (uv__queue *)0x1bc5ee;
    uv_run((uv_loop_t *)pcVar12,UV_RUN_DEFAULT);
    puStackY_8e8 = (uv__queue *)0x1bc5fc;
    puVar8 = uv_default_loop();
    puStackY_8e8 = (uv__queue *)0x1bc604;
    iVar6 = uv_loop_close(puVar8);
    if (iVar6 == 0) {
      puStackY_8e8 = (uv__queue *)0x1bc620;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_8e8 = (uv__queue *)0x1bc63f;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_1();
LAB_001bc63f:
    puStackY_8e8 = (uv__queue *)0x1bc64e;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_15();
LAB_001bc64e:
    puStackY_8e8 = (uv__queue *)0x1bc65d;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_2();
LAB_001bc65d:
    puStackY_8e8 = (uv__queue *)0x1bc66c;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_14();
LAB_001bc66c:
    puStackY_8e8 = (uv__queue *)0x1bc67b;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_3();
LAB_001bc67b:
    puStackY_8e8 = (uv__queue *)0x1bc68a;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_4();
LAB_001bc68a:
    puStackY_8e8 = (uv__queue *)0x1bc699;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_5();
LAB_001bc699:
    puStackY_8e8 = (uv__queue *)0x1bc6a8;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_6();
    pcVar11 = (char *)unaff_R14;
LAB_001bc6a8:
    puStackY_8e8 = (uv__queue *)0x1bc6b7;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_13();
LAB_001bc6b7:
    puStackY_8e8 = (uv__queue *)0x1bc6c6;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_7();
LAB_001bc6c6:
    puStackY_8e8 = (uv__queue *)0x1bc6d5;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_8();
LAB_001bc6d5:
    puStackY_8e8 = (uv__queue *)0x1bc6e4;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_12();
LAB_001bc6e4:
    puStackY_8e8 = (uv__queue *)0x1bc6f3;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_9();
LAB_001bc6f3:
    puStackY_8e8 = (uv__queue *)0x1bc702;
    run_test_spawn_stdout_and_stderr_to_file_swap_cold_10();
  }
  puStackY_8e8 = (uv__queue *)run_test_spawn_stdin;
  run_test_spawn_stdout_and_stderr_to_file_swap_cold_11();
  iVar13 = (int)auStackY_d10 + 0x118;
  builtin_strncpy(acStackY_bd8,"hello-from-spawn_stdin",0x17);
  auStackY_d10._272_8_ = (uv_async_cb)0x1bc74b;
  puStackY_8f8 = (uv_loop_t *)pcVar12;
  puStackY_8f0 = (uv_fs_t *)pcVar11;
  puStackY_8e8 = unaff_R15;
  init_process_options("spawn_helper3",exit_cb);
  auStackY_d10._272_8_ = (uv_async_cb)0x1bc750;
  puVar9 = uv_default_loop();
  puVar8 = (uv_loop_t *)&uStackY_9e0;
  auStackY_d10._272_8_ = (uv_async_cb)0x1bc765;
  uv_pipe_init(puVar9,(uv_pipe_t *)puVar8,0);
  auStackY_d10._272_8_ = (uv_async_cb)0x1bc76a;
  puVar9 = uv_default_loop();
  auStackY_d10._272_8_ = (uv_async_cb)0x1bc77f;
  uv_pipe_init(puVar9,(uv_pipe_t *)&uStackY_ac8,0);
  options.stdio = &uStackY_bb8;
  uStackY_bb8.flags = UV_READABLE_PIPE|UV_CREATE_PIPE;
  uStackY_ba8 = 0x21;
  options.stdio_count = 2;
  auStackY_d10._272_8_ = (uv_async_cb)0x1bc7b6;
  uStackY_bb8.data.stream = &uStackY_ac8;
  puStackY_ba0 = puVar8;
  puVar9 = uv_default_loop();
  auStackY_d10._272_8_ = (uv_async_cb)0x1bc7c8;
  iVar6 = uv_spawn(puVar9,&process,&options);
  uStackY_b90.data = (void *)(long)iVar6;
  auStackY_be8._0_8_ = (char *)0x0;
  if ((uv__queue *)uStackY_b90.data == (uv__queue *)0x0) {
    auStackY_be8._0_8_ = acStackY_bd8;
    auStackY_be8._8_8_ = 0x17;
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc81b;
    iVar6 = uv_write(&uStackY_b90,&uStackY_ac8,(uv_buf_t *)auStackY_be8,1,write_cb);
    auStackY_d10._288_8_ = SEXT48(iVar6);
    auStackY_d10._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d10._288_8_ != (uv__queue *)0x0) goto LAB_001bc981;
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc854;
    iVar6 = uv_read_start(&uStackY_9e0,on_alloc,on_read);
    auStackY_d10._288_8_ = SEXT48(iVar6);
    auStackY_d10._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d10._288_8_ != (uv__queue *)0x0) goto LAB_001bc98e;
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc877;
    puVar9 = uv_default_loop();
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc881;
    iVar6 = uv_run(puVar9,UV_RUN_DEFAULT);
    auStackY_d10._288_8_ = SEXT48(iVar6);
    auStackY_d10._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d10._288_8_ != (uv__queue *)0x0) goto LAB_001bc99b;
    auStackY_d10._288_8_ = (uv__queue *)0x1;
    auStackY_d10._280_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_d10._280_8_ != (uv__queue *)0x1) goto LAB_001bc9a8;
    auStackY_d10._288_8_ = (uv__queue *)0x3;
    auStackY_d10._280_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_d10._280_8_ != (uv__queue *)0x3) goto LAB_001bc9b5;
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc8f6;
    iVar6 = strcmp(acStackY_bd8,output);
    auStackY_d10._288_8_ = SEXT48(iVar6);
    auStackY_d10._280_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_d10._288_8_ != (uv__queue *)0x0) goto LAB_001bc9c2;
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc919;
    puVar8 = uv_default_loop();
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc92d;
    uv_walk(puVar8,close_walk_cb,(void *)0x0);
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc937;
    uv_run(puVar8,UV_RUN_DEFAULT);
    auStackY_d10._288_8_ = (uv__queue *)0x0;
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc945;
    puVar9 = uv_default_loop();
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc94d;
    iVar6 = uv_loop_close(puVar9);
    auStackY_d10._280_8_ = SEXT48(iVar6);
    if (auStackY_d10._288_8_ == auStackY_d10._280_8_) {
      auStackY_d10._272_8_ = (uv_async_cb)0x1bc963;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc981;
    run_test_spawn_stdin_cold_1();
LAB_001bc981:
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc98e;
    run_test_spawn_stdin_cold_2();
LAB_001bc98e:
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc99b;
    run_test_spawn_stdin_cold_3();
LAB_001bc99b:
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc9a8;
    run_test_spawn_stdin_cold_4();
LAB_001bc9a8:
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc9b5;
    run_test_spawn_stdin_cold_5();
LAB_001bc9b5:
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc9c2;
    run_test_spawn_stdin_cold_6();
LAB_001bc9c2:
    auStackY_d10._272_8_ = (uv_async_cb)0x1bc9cf;
    run_test_spawn_stdin_cold_7();
  }
  puVar14 = auStackY_d10 + 0x120;
  auStackY_d10._272_8_ = write_cb;
  run_test_spawn_stdin_cold_8();
  auStackY_d10._272_8_ = SEXT48(iVar13);
  auStackY_d10._264_8_ = 0;
  if ((uv_async_cb)auStackY_d10._272_8_ == (uv_async_cb)0x0) {
    uv_close(*(uv_handle_t **)(puVar14 + 0x58),close_cb);
    return extraout_EAX;
  }
  auStackY_d10._248_8_ = run_test_spawn_stdio_greater_than_3;
  write_cb_cold_1();
  uStackY_e40.queued_fds = (void *)0x1bca3e;
  auStackY_d10._232_8_ = puVar8;
  auStackY_d10._240_8_ = &uStackY_ac8;
  auStackY_d10._248_8_ = unaff_RBP;
  init_process_options("spawn_helper5",exit_cb);
  uStackY_e40.queued_fds = (void *)0x1bca43;
  puVar8 = uv_default_loop();
  puVar10 = (uv_process_options_t *)auStackY_d10;
  uStackY_e40.queued_fds = (void *)0x1bca57;
  uv_pipe_init(puVar8,(uv_pipe_t *)puVar10,0);
  options.stdio = &uStackY_d58;
  uStackY_d58.flags = UV_IGNORE;
  uStackY_d48 = 0;
  uStackY_d38 = 0;
  uStackY_d28 = 0x21;
  options.stdio_count = 4;
  uStackY_e40.queued_fds = (void *)0x1bca8c;
  puStackY_d20 = (uv_loop_t *)puVar10;
  puVar8 = uv_default_loop();
  uStackY_e40.queued_fds = (void *)0x1bca9e;
  iVar6 = uv_spawn(puVar8,&process,&options);
  lStackY_d60 = (long)iVar6;
  lStackY_d68 = 0;
  if (lStackY_d60 == 0) {
    uStackY_e40.queued_fds = (void *)0x1bcad4;
    iVar6 = uv_read_start((uv_stream_t *)auStackY_d10,on_alloc,on_read);
    lStackY_d60 = (long)iVar6;
    lStackY_d68 = 0;
    if (lStackY_d60 != 0) goto LAB_001bcc14;
    uStackY_e40.queued_fds = (void *)0x1bcaf7;
    puVar8 = uv_default_loop();
    uStackY_e40.queued_fds = (void *)0x1bcb01;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    lStackY_d60 = (long)iVar6;
    lStackY_d68 = 0;
    if (lStackY_d60 != 0) goto LAB_001bcc21;
    lStackY_d60 = 1;
    lStackY_d68 = (long)exit_cb_called;
    if (lStackY_d68 != 1) goto LAB_001bcc2e;
    lStackY_d60 = 2;
    lStackY_d68 = (long)close_cb_called;
    if (lStackY_d68 != 2) goto LAB_001bcc3b;
    uStackY_e40.queued_fds = (void *)0x1bcb7d;
    printf("output from stdio[3] is: %s",output);
    uStackY_e40.queued_fds = (void *)0x1bcb8c;
    iVar6 = strcmp("fourth stdio!\n",output);
    lStackY_d60 = (long)iVar6;
    lStackY_d68 = 0;
    puVar10 = (uv_process_options_t *)output;
    if (lStackY_d60 != 0) goto LAB_001bcc48;
    uStackY_e40.queued_fds = (void *)0x1bcbaf;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    uStackY_e40.queued_fds = (void *)0x1bcbc3;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    uStackY_e40.queued_fds = (void *)0x1bcbcd;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    lStackY_d60 = 0;
    uStackY_e40.queued_fds = (void *)0x1bcbdb;
    puVar8 = uv_default_loop();
    uStackY_e40.queued_fds = (void *)0x1bcbe3;
    iVar6 = uv_loop_close(puVar8);
    lStackY_d68 = (long)iVar6;
    if (lStackY_d60 == lStackY_d68) {
      uStackY_e40.queued_fds = (void *)0x1bcbf9;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    uStackY_e40.queued_fds = (void *)0x1bcc14;
    run_test_spawn_stdio_greater_than_3_cold_1();
LAB_001bcc14:
    uStackY_e40.queued_fds = (void *)0x1bcc21;
    run_test_spawn_stdio_greater_than_3_cold_2();
LAB_001bcc21:
    uStackY_e40.queued_fds = (void *)0x1bcc2e;
    run_test_spawn_stdio_greater_than_3_cold_3();
LAB_001bcc2e:
    uStackY_e40.queued_fds = (void *)0x1bcc3b;
    run_test_spawn_stdio_greater_than_3_cold_4();
LAB_001bcc3b:
    uStackY_e40.queued_fds = (void *)0x1bcc48;
    run_test_spawn_stdio_greater_than_3_cold_5();
LAB_001bcc48:
    uStackY_e40.queued_fds = (void *)0x1bcc55;
    run_test_spawn_stdio_greater_than_3_cold_6();
  }
  uStackY_e40.queued_fds = spawn_tcp_server_helper;
  run_test_spawn_stdio_greater_than_3_cold_7();
  puStackY_e58 = (uv_loop_t *)0x1bcc6e;
  puVar8 = uv_default_loop();
  puStackY_e58 = (uv_loop_t *)0x1bcc7b;
  iVar6 = uv_tcp_init(puVar8,&uStackY_e40);
  lStackY_e48 = (long)iVar6;
  uStackY_e50 = 0;
  if (lStackY_e48 == 0) {
    puStackY_e58 = (uv_loop_t *)0x1bcca4;
    iVar6 = uv_tcp_open(&uStackY_e40,3);
    lStackY_e48 = (long)iVar6;
    uStackY_e50 = 0;
    if (lStackY_e48 != 0) goto LAB_001bcd03;
    puStackY_e58 = (uv_loop_t *)0x1bcccf;
    iVar6 = uv_listen((uv_stream_t *)&uStackY_e40,0x1000,(uv_connection_cb)0x0);
    lStackY_e48 = (long)iVar6;
    uStackY_e50 = 0;
    if (lStackY_e48 == 0) {
      return 1;
    }
  }
  else {
    puStackY_e58 = (uv_loop_t *)0x1bcd03;
    spawn_tcp_server_helper_cold_1();
LAB_001bcd03:
    puStackY_e58 = (uv_loop_t *)0x1bcd10;
    spawn_tcp_server_helper_cold_2();
  }
  puStackY_e58 = (uv_loop_t *)run_test_spawn_tcp_server;
  spawn_tcp_server_helper_cold_3();
  puStackY_ed0 = (uv_process_options_t *)0x1bcd35;
  puStackY_e58 = (uv_loop_t *)puVar10;
  init_process_options("spawn_tcp_server_helper",exit_cb);
  puStackY_ed0 = (uv_process_options_t *)0x1bcd4b;
  iVar6 = uv_ip4_addr("127.0.0.1",0x23a3,&sStackY_e68);
  uStackY_ea8._0_8_ = SEXT48(iVar6);
  lStackY_ec0 = 0;
  if (uStackY_ea8._0_8_ == 0) {
    puStackY_ed0 = (uv_process_options_t *)0x1bcd70;
    puVar8 = uv_default_loop();
    puStackY_ed0 = (uv_process_options_t *)0x1bcd84;
    iVar6 = uv_tcp_init_ex(puVar8,&tcp_server,2);
    uStackY_ea8._0_8_ = SEXT48(iVar6);
    lStackY_ec0 = 0;
    if (uStackY_ea8._0_8_ != 0) goto LAB_001bcf69;
    puStackY_ed0 = (uv_process_options_t *)0x1bcdb7;
    iVar6 = uv_tcp_bind(&tcp_server,(sockaddr *)&sStackY_e68,0);
    uStackY_ea8._0_8_ = SEXT48(iVar6);
    lStackY_ec0 = 0;
    if (uStackY_ea8._0_8_ != 0) goto LAB_001bcf78;
    puStackY_ed0 = (uv_process_options_t *)0x1bcde8;
    iVar6 = uv_fileno((uv_handle_t *)&tcp_server,&uStackY_eac);
    uStackY_ea8._0_8_ = SEXT48(iVar6);
    lStackY_ec0 = 0;
    if (uStackY_ea8._0_8_ != 0) goto LAB_001bcf87;
    options.stdio = &uStackY_ea8;
    puVar10 = &options;
    uStackY_ea8._4_4_ = iVar6 >> 0x1f;
    uStackY_ea8.flags = 2;
    uStackY_ea8.data.file = 0;
    uStackY_e98 = 2;
    uStackY_e90 = 1;
    uStackY_e88 = 2;
    uStackY_e80 = 2;
    uStackY_e78 = 2;
    uStackY_e70 = uStackY_eac;
    options.stdio_count = 4;
    puStackY_ed0 = (uv_process_options_t *)0x1bce52;
    puVar8 = uv_default_loop();
    puStackY_ed0 = (uv_process_options_t *)0x1bce64;
    iVar6 = uv_spawn(puVar8,&process,&options);
    lStackY_ec0 = (long)iVar6;
    lStackY_eb8 = 0;
    if (lStackY_ec0 != 0) goto LAB_001bcf96;
    puStackY_ed0 = (uv_process_options_t *)0x1bce89;
    puVar8 = uv_default_loop();
    puStackY_ed0 = (uv_process_options_t *)0x1bce93;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    lStackY_ec0 = (long)iVar6;
    lStackY_eb8 = 0;
    if (lStackY_ec0 != 0) goto LAB_001bcfa5;
    lStackY_ec0 = 1;
    lStackY_eb8 = (long)exit_cb_called;
    if (lStackY_eb8 != 1) goto LAB_001bcfb4;
    lStackY_ec0 = 1;
    lStackY_eb8 = (long)close_cb_called;
    if (lStackY_eb8 != 1) goto LAB_001bcfc3;
    puStackY_ed0 = (uv_process_options_t *)0x1bcf02;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    puStackY_ed0 = (uv_process_options_t *)0x1bcf16;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    puStackY_ed0 = (uv_process_options_t *)0x1bcf20;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    lStackY_ec0 = 0;
    puStackY_ed0 = (uv_process_options_t *)0x1bcf2e;
    puVar8 = uv_default_loop();
    puStackY_ed0 = (uv_process_options_t *)0x1bcf36;
    iVar6 = uv_loop_close(puVar8);
    lStackY_eb8 = (long)iVar6;
    if (lStackY_ec0 == lStackY_eb8) {
      puStackY_ed0 = (uv_process_options_t *)0x1bcf52;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_ed0 = (uv_process_options_t *)0x1bcf69;
    run_test_spawn_tcp_server_cold_1();
LAB_001bcf69:
    puStackY_ed0 = (uv_process_options_t *)0x1bcf78;
    run_test_spawn_tcp_server_cold_2();
LAB_001bcf78:
    puStackY_ed0 = (uv_process_options_t *)0x1bcf87;
    run_test_spawn_tcp_server_cold_3();
LAB_001bcf87:
    puStackY_ed0 = (uv_process_options_t *)0x1bcf96;
    run_test_spawn_tcp_server_cold_4();
LAB_001bcf96:
    puStackY_ed0 = (uv_process_options_t *)0x1bcfa5;
    run_test_spawn_tcp_server_cold_5();
LAB_001bcfa5:
    puStackY_ed0 = (uv_process_options_t *)0x1bcfb4;
    run_test_spawn_tcp_server_cold_6();
LAB_001bcfb4:
    puStackY_ed0 = (uv_process_options_t *)0x1bcfc3;
    run_test_spawn_tcp_server_cold_7();
LAB_001bcfc3:
    puStackY_ed0 = (uv_process_options_t *)0x1bcfd2;
    run_test_spawn_tcp_server_cold_8();
  }
  puStackY_ed0 = (uv_process_options_t *)run_test_spawn_ignored_stdio;
  run_test_spawn_tcp_server_cold_9();
  puStackY_ed0 = &options;
  puStackY_ef8 = (uv_loop_t *)0x1bcffb;
  puStackY_ed8 = (uv_loop_t *)puVar10;
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  puVar10 = &options;
  options.stdio_count = 0;
  puStackY_ef8 = (uv_loop_t *)0x1bd01b;
  puVar8 = uv_default_loop();
  puStackY_ef8 = (uv_loop_t *)0x1bd02d;
  iVar6 = uv_spawn(puVar8,&process,&options);
  lStackY_ee0 = (long)iVar6;
  lStackY_ee8 = 0;
  if (lStackY_ee0 == 0) {
    puStackY_ef8 = (uv_loop_t *)0x1bd04e;
    puVar8 = uv_default_loop();
    puStackY_ef8 = (uv_loop_t *)0x1bd058;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    lStackY_ee0 = (long)iVar6;
    lStackY_ee8 = 0;
    if (lStackY_ee0 != 0) goto LAB_001bd12c;
    lStackY_ee0 = 1;
    lStackY_ee8 = (long)exit_cb_called;
    if (lStackY_ee8 != 1) goto LAB_001bd13b;
    lStackY_ee0 = 1;
    lStackY_ee8 = (long)close_cb_called;
    if (lStackY_ee8 != 1) goto LAB_001bd14a;
    puStackY_ef8 = (uv_loop_t *)0x1bd0c7;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    puStackY_ef8 = (uv_loop_t *)0x1bd0db;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    puStackY_ef8 = (uv_loop_t *)0x1bd0e5;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    lStackY_ee0 = 0;
    puStackY_ef8 = (uv_loop_t *)0x1bd0f3;
    puVar8 = uv_default_loop();
    puStackY_ef8 = (uv_loop_t *)0x1bd0fb;
    iVar6 = uv_loop_close(puVar8);
    lStackY_ee8 = (long)iVar6;
    if (lStackY_ee0 == lStackY_ee8) {
      puStackY_ef8 = (uv_loop_t *)0x1bd113;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStackY_ef8 = (uv_loop_t *)0x1bd12c;
    run_test_spawn_ignored_stdio_cold_1();
LAB_001bd12c:
    puStackY_ef8 = (uv_loop_t *)0x1bd13b;
    run_test_spawn_ignored_stdio_cold_2();
LAB_001bd13b:
    puStackY_ef8 = (uv_loop_t *)0x1bd14a;
    run_test_spawn_ignored_stdio_cold_3();
LAB_001bd14a:
    puStackY_ef8 = (uv_loop_t *)0x1bd159;
    run_test_spawn_ignored_stdio_cold_4();
  }
  puStackY_ef8 = (uv_loop_t *)run_test_spawn_and_kill;
  run_test_spawn_ignored_stdio_cold_5();
  puVar14 = auStackY_f28 + 0x20;
  auStackY_f28._24_8_ = (uv_close_cb)0x1bd180;
  puStackY_ef8 = (uv_loop_t *)puVar10;
  init_process_options("spawn_helper4",kill_cb);
  auStackY_f28._24_8_ = (uv_close_cb)0x1bd185;
  puVar8 = uv_default_loop();
  auStackY_f28._24_8_ = (uv_close_cb)0x1bd19b;
  iVar6 = uv_spawn(puVar8,&process,&options);
  auStackY_f28._40_8_ = SEXT48(iVar6);
  auStackY_f28._32_8_ = (uv__queue *)0x0;
  if ((uv__queue *)auStackY_f28._40_8_ == (uv__queue *)0x0) {
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd1be;
    puVar8 = uv_default_loop();
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd1cd;
    iVar6 = uv_timer_init(puVar8,&timer);
    auStackY_f28._40_8_ = SEXT48(iVar6);
    auStackY_f28._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_f28._40_8_ != (uv__queue *)0x0) goto LAB_001bd2fa;
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd205;
    iVar6 = uv_timer_start(&timer,timer_cb,500,0);
    auStackY_f28._40_8_ = SEXT48(iVar6);
    auStackY_f28._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_f28._40_8_ != (uv__queue *)0x0) goto LAB_001bd307;
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd228;
    puVar8 = uv_default_loop();
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd232;
    iVar6 = uv_run(puVar8,UV_RUN_DEFAULT);
    auStackY_f28._40_8_ = SEXT48(iVar6);
    auStackY_f28._32_8_ = (uv__queue *)0x0;
    if ((uv__queue *)auStackY_f28._40_8_ != (uv__queue *)0x0) goto LAB_001bd314;
    auStackY_f28._40_8_ = (uv__queue *)0x1;
    auStackY_f28._32_8_ = SEXT48(exit_cb_called);
    if ((uv__queue *)auStackY_f28._32_8_ != (uv__queue *)0x1) goto LAB_001bd321;
    auStackY_f28._40_8_ = (uv__queue *)0x2;
    auStackY_f28._32_8_ = SEXT48(close_cb_called);
    if ((uv__queue *)auStackY_f28._32_8_ != (uv__queue *)0x2) goto LAB_001bd32e;
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd29b;
    puVar10 = (uv_process_options_t *)uv_default_loop();
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd2af;
    uv_walk((uv_loop_t *)puVar10,close_walk_cb,(void *)0x0);
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd2b9;
    uv_run((uv_loop_t *)puVar10,UV_RUN_DEFAULT);
    auStackY_f28._40_8_ = (uv__queue *)0x0;
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd2c7;
    puVar8 = uv_default_loop();
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd2cf;
    iVar6 = uv_loop_close(puVar8);
    auStackY_f28._32_8_ = SEXT48(iVar6);
    if (auStackY_f28._40_8_ == auStackY_f28._32_8_) {
      auStackY_f28._24_8_ = (uv_close_cb)0x1bd2e5;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd2fa;
    run_test_spawn_and_kill_cold_1();
LAB_001bd2fa:
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd307;
    run_test_spawn_and_kill_cold_2();
LAB_001bd307:
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd314;
    run_test_spawn_and_kill_cold_3();
LAB_001bd314:
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd321;
    run_test_spawn_and_kill_cold_4();
LAB_001bd321:
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd32e;
    run_test_spawn_and_kill_cold_5();
LAB_001bd32e:
    auStackY_f28._24_8_ = (uv_close_cb)0x1bd33b;
    run_test_spawn_and_kill_cold_6();
  }
  puVar15 = (uv_handle_t *)(auStackY_f28 + 0x28);
  auStackY_f28._24_8_ = kill_cb;
  run_test_spawn_and_kill_cold_7();
  auStackY_f28._24_8_ = (uv_close_cb)0x0;
  auStackY_f28._16_8_ = 0;
  auStackY_f28._8_8_ = puVar10;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  auStackY_f28._0_8_ = puVar14;
  if (puVar14 == (undefined1 *)0x0) {
    if (extraout_EDX != 0xf) goto LAB_001bd3e9;
    uv_close(puVar15,close_cb);
    auStackY_f28._0_8_ = SEXT48(*(int *)&puVar15[1].loop);
    if ((undefined1 *)auStackY_f28._0_8_ != (undefined1 *)0x0) {
      iVar6 = uv_kill(*(int *)&puVar15[1].loop,0);
      auStackY_f28._0_8_ = SEXT48(iVar6);
      if ((undefined1 *)auStackY_f28._0_8_ == (undefined1 *)0xfffffffffffffffd) {
        return iVar6;
      }
      goto LAB_001bd3fb;
    }
  }
  else {
    kill_cb_cold_1();
LAB_001bd3e9:
    kill_cb_cold_2();
  }
  kill_cb_cold_4();
LAB_001bd3fb:
  puVar15 = (uv_handle_t *)auStackY_f28;
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  uv_close(puVar15,close_cb);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(spawn_stdout_to_file) {
  int r;
  uv_os_fd_t file;
  uv_fs_t fs_req;
  uv_stdio_container_t stdio[2];
  uv_buf_t buf;

  /* Setup. */
  unlink("stdout_file");

  init_process_options("spawn_helper2", exit_cb);

  r = uv_fs_open(NULL, &fs_req, "stdout_file", UV_FS_O_CREAT | UV_FS_O_RDWR,
      S_IRUSR | S_IWUSR, NULL);
  ASSERT_OK(r);
  file = (uv_os_fd_t)fs_req.result;
  uv_fs_req_cleanup(&fs_req);

  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.file = file;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(1, close_cb_called);

  buf = uv_buf_init(output, sizeof(output));
  r = uv_fs_read(NULL, &fs_req, file, &buf, 1, 0, NULL);
  ASSERT_EQ(12, r);
  uv_fs_req_cleanup(&fs_req);

  r = uv_fs_close(NULL, &fs_req, file, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&fs_req);

  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\n", output));

  /* Cleanup. */
  unlink("stdout_file");

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}